

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

ssize_t send_callback(nghttp2_session *h2,uint8_t *buf,size_t blen,int flags,void *userp)

{
  ssize_t local_68;
  CURLcode local_5c;
  nghttp2_session *pnStack_58;
  CURLcode result;
  ssize_t nwritten;
  Curl_easy *data;
  cf_h2_ctx *ctx;
  Curl_cfilter *cf;
  void *userp_local;
  size_t sStack_28;
  int flags_local;
  size_t blen_local;
  uint8_t *buf_local;
  nghttp2_session *h2_local;
  
  data = *(Curl_easy **)((long)userp + 0x10);
  if (userp == (void *)0x0) {
    local_68 = 0;
  }
  else {
    local_68 = *(ssize_t *)(*(long *)((long)userp + 0x10) + 0x10);
  }
  nwritten = local_68;
  local_5c = CURLE_OK;
  ctx = (cf_h2_ctx *)userp;
  cf = (Curl_cfilter *)userp;
  userp_local._4_4_ = flags;
  sStack_28 = blen;
  blen_local = (size_t)buf;
  buf_local = (uint8_t *)h2;
  pnStack_58 = (nghttp2_session *)
               Curl_bufq_write_pass((bufq *)&data->mstate,buf,blen,nw_out_writer,userp,&local_5c);
  if ((long)pnStack_58 < 0) {
    if (local_5c == CURLE_AGAIN) {
      *(byte *)&data->multi_easy = *(byte *)&data->multi_easy & 0xf7 | 8;
      h2_local = (nghttp2_session *)0xfffffffffffffe08;
    }
    else {
      Curl_failf((Curl_easy *)nwritten,"Failed sending HTTP2 data");
      h2_local = (nghttp2_session *)0xfffffffffffffc7a;
    }
  }
  else {
    h2_local = pnStack_58;
    if (pnStack_58 == (nghttp2_session *)0x0) {
      *(byte *)&data->multi_easy = *(byte *)&data->multi_easy & 0xf7 | 8;
      h2_local = (nghttp2_session *)0xfffffffffffffe08;
    }
  }
  return (ssize_t)h2_local;
}

Assistant:

static ssize_t send_callback(nghttp2_session *h2,
                             const uint8_t *buf, size_t blen, int flags,
                             void *userp)
{
  struct Curl_cfilter *cf = userp;
  struct cf_h2_ctx *ctx = cf->ctx;
  struct Curl_easy *data = CF_DATA_CURRENT(cf);
  ssize_t nwritten;
  CURLcode result = CURLE_OK;

  (void)h2;
  (void)flags;
  DEBUGASSERT(data);

  nwritten = Curl_bufq_write_pass(&ctx->outbufq, buf, blen,
                                  nw_out_writer, cf, &result);
  if(nwritten < 0) {
    if(result == CURLE_AGAIN) {
      ctx->nw_out_blocked = 1;
      return NGHTTP2_ERR_WOULDBLOCK;
    }
    failf(data, "Failed sending HTTP2 data");
    return NGHTTP2_ERR_CALLBACK_FAILURE;
  }

  if(!nwritten) {
    ctx->nw_out_blocked = 1;
    return NGHTTP2_ERR_WOULDBLOCK;
  }
  return nwritten;
}